

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_map.hpp
# Opt level: O2

pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
 __thiscall
itlib::
flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
::
emplace<std::__cxx11::string_const&,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>
          (flat_map<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>,std::allocator<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_> *args_1
          )

{
  undefined1 auVar1 [12];
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>_>_>_>,_bool>
  pVar2;
  value_type val;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
  local_40;
  
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
  ::
  pair<std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>,_true>
            (&local_40,args,args_1);
  pVar2 = insert<std::pair<std::__cxx11::string,std::unique_ptr<Rml::VariableDefinition,std::default_delete<Rml::VariableDefinition>>>>
                    (this,&local_40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
  ::~pair(&local_40);
  auVar1 = pVar2._0_12_;
  pVar2._12_4_ = 0;
  pVar2.first._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::VariableDefinition,_std::default_delete<Rml::VariableDefinition>_>_>
        *)auVar1._0_8_;
  pVar2.second = (bool)auVar1[8];
  pVar2._9_3_ = auVar1._9_3_;
  return pVar2;
}

Assistant:

std::pair<iterator, bool> emplace(Args&&... args)
    {
        value_type val(std::forward<Args>(args)...);
        return insert(std::move(val));
    }